

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MersenneTwister.h
# Opt level: O0

uint32 MTRand::hash(time_t t,clock_t c)

{
  uint32 uVar1;
  ulong local_40;
  size_t j;
  uint32 h2;
  size_t i;
  uchar *p;
  uint32 h1;
  clock_t c_local;
  time_t t_local;
  
  uVar1 = hash::differ;
  p = (uchar *)0x0;
  for (h2 = 0; h2 < 8; h2 = h2 + 1) {
    p = (uchar *)((ulong)*(byte *)((long)&c_local + h2) + (long)p * 0x101);
  }
  j = 0;
  for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
    j = (ulong)*(byte *)((long)&h1 + local_40) + j * 0x101;
  }
  hash::differ = hash::differ + 1;
  return (ulong)(p + uVar1) ^ j;
}

Assistant:

inline MTRand::uint32 MTRand::hash( time_t t, clock_t c )
{
	// Get a uint32 from t and c
	// Better than uint32(x) in case x is floating point in [0,1]
	// Based on code by Lawrence Kirby (fred@genesis.demon.co.uk)

	static uint32 differ = 0;  // guarantee time-based seeds will change

	uint32 h1 = 0;
	unsigned char *p = (unsigned char *) &t;
	for( size_t i = 0; i < sizeof(t); ++i )
	{
		h1 *= UCHAR_MAX + 2U;
		h1 += p[i];
	}
	uint32 h2 = 0;
	p = (unsigned char *) &c;
	for( size_t j = 0; j < sizeof(c); ++j )
	{
		h2 *= UCHAR_MAX + 2U;
		h2 += p[j];
	}
	return ( h1 + differ++ ) ^ h2;
}